

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O0

void __thiscall
spdlog::details::async_msg::async_msg
          (async_msg *this,async_logger_ptr *worker,async_msg_type the_type,log_msg *m)

{
  uint32_t uVar1;
  undefined4 uVar2;
  basic_memory_buffer<char,_176UL,_std::allocator<char>_> *dest;
  string_view_t view;
  allocator<char> local_29;
  log_msg *local_28;
  log_msg *m_local;
  async_logger_ptr *paStack_18;
  async_msg_type the_type_local;
  async_logger_ptr *worker_local;
  async_msg *this_local;
  
  this->msg_type = the_type;
  this->level = m->level;
  (this->time).__d.__r = (m->time).__d.__r;
  dest = (basic_memory_buffer<char,_176UL,_std::allocator<char>_> *)m->thread_id;
  this->thread_id = (size_t)dest;
  local_28 = m;
  m_local._4_4_ = the_type;
  paStack_18 = worker;
  worker_local = (async_logger_ptr *)this;
  std::allocator<char>::allocator();
  fmt::v5::basic_memory_buffer<char,_176UL,_std::allocator<char>_>::basic_memory_buffer
            (&this->raw,&local_29);
  std::allocator<char>::~allocator(&local_29);
  this->msg_id = local_28->msg_id;
  uVar1 = (local_28->source).line;
  uVar2 = *(undefined4 *)&(local_28->source).field_0xc;
  (this->source).filename = (local_28->source).filename;
  (this->source).line = uVar1;
  *(undefined4 *)&(this->source).field_0xc = uVar2;
  std::shared_ptr<spdlog::async_logger>::shared_ptr(&this->worker_ptr,paStack_18);
  view._M_str = &this->raw;
  view._M_len = (size_t)(local_28->payload)._M_str;
  fmt_helper::append_string_view<176ul>((fmt_helper *)(local_28->payload)._M_len,view,dest);
  return;
}

Assistant:

async_msg(async_logger_ptr &&worker, async_msg_type the_type, details::log_msg &m)
        : msg_type(the_type)
        , level(m.level)
        , time(m.time)
        , thread_id(m.thread_id)
        , msg_id(m.msg_id)
        , source(m.source)
        , worker_ptr(std::move(worker))
    {
        fmt_helper::append_string_view(m.payload, raw);
    }